

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

void __thiscall FIX::Message::Message(Message *this,BeginString *beginString,MsgType *msgType)

{
  Header *this_00;
  message_order local_48;
  
  local_48.m_mode = normal;
  local_48._4_8_ = 0;
  local_48.m_groupOrder._4_8_ = 0;
  local_48._20_8_ = 0;
  FieldMap::FieldMap(&this->super_FieldMap,&local_48);
  shared_array<int>::release(&local_48.m_groupOrder);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001ee400;
  this_00 = &this->m_header;
  Header::Header(this_00);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  FieldMap::setField(&this_00->super_FieldMap,(FieldBase *)beginString,true);
  FieldMap::setField(&this_00->super_FieldMap,(FieldBase *)msgType,true);
  return;
}

Assistant:

Message::Message( const BeginString& beginString, const MsgType& msgType )
: m_validStructure(true)
, m_tag( 0 )
{
  m_header.setField(beginString);
  m_header.setField(msgType);
}